

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp.h
# Opt level: O0

void __thiscall kiste::cpp::escape(cpp *this,char *c)

{
  char cVar1;
  char *c_local;
  cpp *this_local;
  
  cVar1 = *c;
  if (cVar1 == '\n') {
    std::operator<<(this->_os,"\\n");
  }
  else if (cVar1 == '\"') {
    std::operator<<(this->_os,"\\\"");
  }
  else if (cVar1 == '\\') {
    std::operator<<(this->_os,"\\\\");
  }
  else {
    std::operator<<(this->_os,*c);
  }
  return;
}

Assistant:

auto escape(const char& c) -> void
    {
      switch (c)
      {
      case '\\':
        _os << "\\\\";
        break;
      case '"':
        _os << "\\\"";
        break;
      case '\n':
        _os << "\\n";
        break;
      default:
        _os << c;
      }
    }